

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.c
# Opt level: O3

int regex_init(regex_handle *re)

{
  void *pvVar1;
  int iVar2;
  
  iVar2 = 0;
  if (re->priv == (void *)0x0) {
    pvVar1 = calloc(1,8);
    if (pvVar1 == (void *)0x0) {
      iVar2 = -0xc;
    }
    else {
      re->priv = pvVar1;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int regex_init(struct regex_handle *re)
{
	struct regex_priv *priv = re->priv;

	if (priv == NULL) {
		priv = calloc(1, sizeof(*priv));
		if (priv == NULL)
			return -ENOMEM;

		re->priv = priv;
	}

	return 0;
}